

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O2

void If_ManImproveNodeUpdate(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vFront)

{
  If_Cut_t *pCut;
  void *pvVar1;
  ulong uVar2;
  uint s;
  uint uVar3;
  long lVar4;
  
  pCut = &pObj->CutBest;
  If_CutAreaDeref(p,pCut);
  (pObj->CutBest).field_0x1f = (char)vFront->nSize;
  for (lVar4 = 0; lVar4 < vFront->nSize; lVar4 = lVar4 + 1) {
    pvVar1 = Vec_PtrEntry(vFront,(int)lVar4);
    *(undefined4 *)(&pObj[1].field_0x0 + lVar4 * 4) = *(undefined4 *)((long)pvVar1 + 4);
  }
  If_CutOrder(pCut);
  uVar3 = 0;
  for (uVar2 = 0; (byte)(pObj->CutBest).field_0x1f != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = uVar3 | 1 << *(uint *)(&pObj[1].field_0x0 + uVar2 * 4) % 0x1f;
  }
  (pObj->CutBest).uSign = uVar3;
  If_CutAreaRef(p,pCut);
  return;
}

Assistant:

void If_ManImproveNodeUpdate( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vFront )
{
    If_Cut_t * pCut;
    If_Obj_t * pFanin;
    int i;
    pCut = If_ObjCutBest(pObj);
    // deref node's cut
    If_CutAreaDeref( p, pCut );
    // update the node's cut
    pCut->nLeaves = Vec_PtrSize(vFront);
    Vec_PtrForEachEntry( If_Obj_t *, vFront, pFanin, i )
        pCut->pLeaves[i] = pFanin->Id;
    If_CutOrder( pCut );
    pCut->uSign = If_ObjCutSignCompute(pCut);
    // ref the new cut
    If_CutAreaRef( p, pCut );
}